

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool WindowedKeyTest<Blob<32>,Blob<160>>
               (hashfunc<Blob<160>_> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  sbyte sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Blob<32> key;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  int local_50;
  uint local_4c;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_48;
  
  uVar7 = (ulong)(uint)windowbits;
  uVar3 = 1 << (windowbits & 0x1fU);
  sVar1 = ((byte)windowbits < 0x21) * (' ' - (byte)windowbits);
  dVar9 = ldexp(1.0,0xa0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (double)(int)uVar3;
  auVar12._0_8_ = ((double)(int)uVar3 * (double)(int)((uint)(-1 << sVar1) >> sVar1)) / dVar9;
  auVar12._8_8_ = 0;
  auVar12 = vminsd_avx(auVar14,auVar12);
  uVar4 = uVar3;
  if (windowbits < 0x19 && auVar12._0_8_ < 0.5) {
    while( true ) {
      dVar9 = log2(auVar14._0_8_ + auVar14._0_8_);
      uVar4 = uVar3;
      if ((int)dVar9 < 0) break;
      uVar4 = uVar3 * 2;
      dVar9 = (double)(int)uVar4;
      dVar10 = log2(dVar9);
      uVar7 = (ulong)(uint)(int)dVar10;
      dVar11 = ldexp(1.0,0xa0);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar9;
      auVar13._0_8_ = ((double)(int)(uVar3 * 2 + -1) * dVar9) / dVar11;
      auVar13._8_8_ = 0;
      auVar12 = vminsd_avx(auVar14,auVar13);
      if ((0.5 <= auVar12._0_8_) || (uVar3 = uVar4, 0x18 < (int)dVar10)) break;
    }
  }
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize(&local_48,(long)(int)uVar4);
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x20,uVar7
         ,0x20);
  bVar6 = true;
  uVar3 = 0;
  local_4c = uVar4;
  do {
    local_50 = 0;
    if (0 < (int)local_4c) {
      iVar5 = 0;
      lVar8 = 0;
      do {
        local_50 = iVar5;
        lrot32(&local_50,4,uVar3);
        (*hash.m_hash)(&local_50,4,0,
                       (local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                        super__Vector_impl_data._M_start)->bytes + lVar8);
        lVar8 = lVar8 + 0x14;
        iVar5 = iVar5 + 1;
      } while ((ulong)uVar4 * 0x14 != lVar8);
    }
    printf("Window at %3d - ",(ulong)uVar3);
    bVar2 = TestHashList<Blob<160>>
                      (&local_48,drawDiagram,testCollision,testDistribution,false,false);
    uVar3 = uVar3 + 1;
    bVar6 = (bool)(bVar6 & bVar2);
  } while (uVar3 != 0x21);
  if (local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  // calc keycount to expect min. 0.5 collisions: EstimateNbCollisions, except for 64++bit.
  // there limit to 2^25 = 33554432 keys
  int keycount = 1 << windowbits;
  while (EstimateNbCollisions(keycount, sizeof(hashtype) * 8) < 0.5 && windowbits < 25) {
    if ((int)log2(2.0 * keycount) < 0) // overflow
      break;
    keycount *= 2;
    windowbits = (int)log2(1.0 * keycount);
    //printf (" enlarge windowbits to %d (%d keys)\n", windowbits, keycount);
    //fflush (NULL);
  }

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;
  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;
    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;
      lrot(&key,sizeof(keytype),minbit);
      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);
    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);
    //printf("\n");
  }

  return result;
}